

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu_p.h
# Opt level: O2

void __thiscall QMenuPrivate::~QMenuPrivate(QMenuPrivate *this)

{
  QPointer<QPlatformMenu> *this_00;
  QMenuScroller *pQVar1;
  Data *pDVar2;
  QObject *pQVar3;
  bool bVar4;
  
  *(undefined ***)&this->super_QWidgetPrivate = &PTR__QMenuPrivate_007d11c0;
  pQVar1 = this->scroll;
  if (pQVar1 != (QMenuScroller *)0x0) {
    QBasicTimer::~QBasicTimer(&pQVar1->scrollTimer);
  }
  operator_delete(pQVar1,0xc);
  this_00 = &this->platformMenu;
  bVar4 = QWeakPointer<QObject>::isNull(&this_00->wp);
  if ((!bVar4) && (pDVar2 = (this_00->wp).d, pDVar2 != (Data *)0x0)) {
    pQVar3 = (this->platformMenu).wp.value;
    if ((*(long *)(*(long *)(pQVar3 + 8) + 0x10) == 0) && (*(int *)(pDVar2 + 4) != 0)) {
      (**(code **)(*(long *)pQVar3 + 0x20))();
    }
  }
  QWeakPointer<QObject>::~QWeakPointer(&(this->popupScreen).wp);
  QWeakPointer<QObject>::~QWeakPointer(&(this->noReplayFor).wp);
  QWeakPointer<QObject>::~QWeakPointer(&(this->actionAboutToTrigger).wp);
  QWeakPointer<QObject>::~QWeakPointer(&this_00->wp);
  QWeakPointer<QObject>::~QWeakPointer(&(this->defaultAction).wp);
  QMenuSloppyState::~QMenuSloppyState(&this->sloppyState);
  QWeakPointer<QObject>::~QWeakPointer(&(this->tornPopup).wp);
  QMenuCaused::~QMenuCaused(&this->causedPopup);
  QWeakPointer<QObject>::~QWeakPointer(&(this->activeMenu).wp);
  QBasicTimer::~QBasicTimer(&this->searchBufferTimer);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->searchBuffer).d);
  QWeakPointer<QObject>::~QWeakPointer(&(this->syncAction).wp);
  QBasicTimer::~QBasicTimer(&(this->delayState).timer);
  QHash<QAction_*,_QWidget_*>::~QHash(&this->widgetItems);
  QArrayDataPointer<QRect>::~QArrayDataPointer(&(this->actionRects).d);
  QWidgetPrivate::~QWidgetPrivate(&this->super_QWidgetPrivate);
  return;
}

Assistant:

~QMenuPrivate()
    {
        delete scroll;
        if (!platformMenu.isNull() && !platformMenu->parent())
            delete platformMenu.data();
    }